

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRun.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_24;
  bool local_1e;
  bool local_1d;
  int i;
  bool testTimeTrace;
  bool testTranslation;
  bool testTranslationSave;
  bool testOutput;
  bool runSpeedTests;
  bool verbose;
  char **argv_local;
  int argc_local;
  
  i._3_1_ = false;
  i._2_1_ = false;
  i._1_1_ = false;
  i._0_1_ = false;
  local_1d = false;
  local_1e = false;
  for (local_24 = 1; local_24 < argc; local_24 = local_24 + 1) {
    iVar1 = strcmp(argv[local_24],"--verbose");
    if ((iVar1 == 0) || (iVar1 = strcmp(argv[local_24],"-v"), iVar1 == 0)) {
      i._3_1_ = true;
    }
    else {
      iVar1 = strcmp(argv[local_24],"--speed");
      if ((iVar1 == 0) || (iVar1 = strcmp(argv[local_24],"-s"), iVar1 == 0)) {
        i._2_1_ = true;
      }
      else {
        iVar1 = strcmp(argv[local_24],"--output");
        if ((iVar1 == 0) || (iVar1 = strcmp(argv[local_24],"-o"), iVar1 == 0)) {
          i._1_1_ = true;
        }
        else {
          iVar1 = strcmp(argv[local_24],"--translate");
          if ((iVar1 == 0) || (iVar1 = strcmp(argv[local_24],"-t"), iVar1 == 0)) {
            i._0_1_ = true;
          }
          else {
            iVar1 = strcmp(argv[local_24],"--executable");
            if ((iVar1 == 0) || (iVar1 = strcmp(argv[local_24],"-e"), iVar1 == 0)) {
              local_1d = true;
            }
            else {
              iVar1 = strcmp(argv[local_24],"--time-trace");
              if ((iVar1 == 0) || (iVar1 = strcmp(argv[local_24],"-r"), iVar1 == 0)) {
                local_1e = true;
              }
            }
          }
        }
      }
    }
  }
  iVar1 = RunTests(i._3_1_,(_func_char_ptr_char_ptr_uint_ptr *)0x0,(_func_void_char_ptr *)0x0,
                   i._2_1_,i._1_1_,i._0_1_,local_1d,local_1e);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
	(void)argv;

	bool verbose = false;
	bool runSpeedTests = false;
	bool testOutput = false;
	bool testTranslationSave = false;
	bool testTranslation = false;
	bool testTimeTrace = false;

	for(int i = 1; i < argc; i++)
	{
		if(strcmp(argv[i], "--verbose") == 0 || strcmp(argv[i], "-v") == 0)
			verbose = true;
		else if(strcmp(argv[i], "--speed") == 0 || strcmp(argv[i], "-s") == 0)
			runSpeedTests = true;
		else if(strcmp(argv[i], "--output") == 0 || strcmp(argv[i], "-o") == 0)
			testOutput = true;
		else if(strcmp(argv[i], "--translate") == 0 || strcmp(argv[i], "-t") == 0)
			testTranslationSave = true;
		else if(strcmp(argv[i], "--executable") == 0 || strcmp(argv[i], "-e") == 0)
			testTranslation = true;
		else if(strcmp(argv[i], "--time-trace") == 0 || strcmp(argv[i], "-r") == 0)
			testTimeTrace = true;
	}

	return RunTests(verbose, 0, 0, runSpeedTests, testOutput, testTranslationSave, testTranslation, testTimeTrace);
}